

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.cpp
# Opt level: O2

void __thiscall
llvm::ManagedStaticBase::RegisterManagedStatic
          (ManagedStaticBase *this,_func_void_ptr *Creator,_func_void_void_ptr *Deleter)

{
  uint __line;
  bool bVar1;
  Mutex *this_00;
  void *pvVar2;
  char *__assertion;
  
  if (Creator == (_func_void_ptr *)0x0) {
    __assertion = "Creator";
    __line = 0x25;
  }
  else {
    bVar1 = llvm_is_multithreaded();
    if (bVar1) {
      this_00 = getManagedStaticMutex();
      sys::MutexImpl::acquire(&this_00->impl);
      if ((this->Ptr)._M_b._M_p == (__pointer_type)0x0) {
        pvVar2 = (*Creator)();
        (this->Ptr)._M_b._M_p = pvVar2;
        this->DeleterFn = Deleter;
        this->Next = StaticList;
        StaticList = this;
      }
      sys::MutexImpl::release(&this_00->impl);
      return;
    }
    if ((((this->Ptr)._M_b._M_p == (__pointer_type)0x0) &&
        (this->DeleterFn == (_func_void_void_ptr *)0x0)) && (this->Next == (ManagedStaticBase *)0x0)
       ) {
      pvVar2 = (*Creator)();
      LOCK();
      (this->Ptr)._M_b._M_p = pvVar2;
      UNLOCK();
      this->DeleterFn = Deleter;
      this->Next = StaticList;
      StaticList = this;
      return;
    }
    __assertion = "!Ptr && !DeleterFn && !Next && \"Partially initialized ManagedStatic!?\"";
    __line = 0x35;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                ,__line,
                "void llvm::ManagedStaticBase::RegisterManagedStatic(void *(*)(), void (*)(void *)) const"
               );
}

Assistant:

void ManagedStaticBase::RegisterManagedStatic(void *(*Creator)(),
                                              void (*Deleter)(void*)) const {
  assert(Creator);
  if (llvm_is_multithreaded()) {
    MutexGuard Lock(*getManagedStaticMutex());

    if (!Ptr.load(std::memory_order_relaxed)) {
      void *Tmp = Creator();

      Ptr.store(Tmp, std::memory_order_release);
      DeleterFn = Deleter;

      // Add to list of managed statics.
      Next = StaticList;
      StaticList = this;
    }
  } else {
    assert(!Ptr && !DeleterFn && !Next &&
           "Partially initialized ManagedStatic!?");
    Ptr = Creator();
    DeleterFn = Deleter;

    // Add to list of managed statics.
    Next = StaticList;
    StaticList = this;
  }
}